

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3Savepoint(Parse *pParse,int op,Token *pName)

{
  int iVar1;
  char *zArg2;
  Vdbe *p;
  
  zArg2 = sqlite3NameFromToken(pParse->db,pName);
  if (zArg2 == (char *)0x0) {
    return;
  }
  p = sqlite3GetVdbe(pParse);
  if ((p != (Vdbe *)0x0) &&
     (iVar1 = sqlite3AuthCheck(pParse,0x20,
                               sqlite3Savepoint_az_rel +
                               *(int *)(sqlite3Savepoint_az_rel + (ulong)(uint)op * 4),zArg2,
                               (char *)0x0), iVar1 == 0)) {
    sqlite3VdbeAddOp4(p,0,op,0,0,zArg2,-6);
    return;
  }
  sqlite3DbFreeNN(pParse->db,zArg2);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Savepoint(Parse *pParse, int op, Token *pName){
  char *zName = sqlite3NameFromToken(pParse->db, pName);
  if( zName ){
    Vdbe *v = sqlite3GetVdbe(pParse);
#ifndef SQLITE_OMIT_AUTHORIZATION
    static const char * const az[] = { "BEGIN", "RELEASE", "ROLLBACK" };
    assert( !SAVEPOINT_BEGIN && SAVEPOINT_RELEASE==1 && SAVEPOINT_ROLLBACK==2 );
#endif
    if( !v || sqlite3AuthCheck(pParse, SQLITE_SAVEPOINT, az[op], zName, 0) ){
      sqlite3DbFree(pParse->db, zName);
      return;
    }
    sqlite3VdbeAddOp4(v, OP_Savepoint, op, 0, 0, zName, P4_DYNAMIC);
  }
}